

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Const *const_)

{
  float fVar1;
  char *pcVar2;
  char *format;
  double dVar3;
  
  switch((const_->type_).enum_) {
  case F64:
    dVar3 = *(double *)(const_->data_).v;
    if ((~(ulong)dVar3 & 0x7ff0000000000000) != 0) {
      pcVar2 = "%.17g";
LAB_00154de5:
      Writef(this,pcVar2,dVar3);
      return;
    }
    pcVar2 = "-";
    if (-1 < (long)dVar3) {
      pcVar2 = "";
    }
    if (((ulong)dVar3 & 0xfffffffffffff) != 0) {
      Writef(this,"f64_reinterpret_i64(0x%016lx) /* %snan:0x%013lx */");
      return;
    }
    break;
  case F32:
    fVar1 = *(float *)(const_->data_).v;
    if ((~(uint)fVar1 & 0x7f800000) != 0) {
      dVar3 = (double)fVar1;
      pcVar2 = "%.9g";
      goto LAB_00154de5;
    }
    pcVar2 = "-";
    if (-1 < (int)fVar1) {
      pcVar2 = "";
    }
    if (((uint)fVar1 & 0x7fffff) != 0) {
      Writef(this,"f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */");
      return;
    }
    break;
  case I64:
    pcVar2 = *(char **)(const_->data_).v;
    format = "%luull";
    goto LAB_00154dc1;
  case I32:
    Writef(this,"%uu",(ulong)*(uint *)(const_->data_).v);
    return;
  default:
    abort();
  }
  format = "%sINFINITY";
LAB_00154dc1:
  Writef(this,format,pcVar2);
  return;
}

Assistant:

Type type() const { return type_; }